

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# er.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  undefined7 extraout_var;
  ostream *poVar4;
  time_t tVar5;
  undefined8 extraout_RAX;
  int iVar6;
  int iVar7;
  ofstream *this;
  int iVar8;
  double dVar9;
  int local_25c;
  float local_258;
  allocator local_251;
  char *local_250;
  ulong local_248;
  int local_240;
  int local_23c;
  double local_238;
  ofstream file_stream;
  byte abStack_210 [480];
  
  bVar1 = false;
  local_258 = 1.0;
  local_25c = -1;
  local_248 = 0;
  iVar6 = 0;
  local_250 = (char *)0x0;
  do {
    pcVar2 = local_250;
    if (argc <= iVar6) {
      if (local_25c != -1) {
        this = &file_stream;
        std::ofstream::ofstream(this,local_250,_S_out);
        if (pcVar2 == (char *)0x0) {
          this = (ofstream *)&std::cout;
        }
        else if ((abStack_210[*(long *)(_file_stream + -0x18)] & 5) != 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"couldn\'t open file ");
          poVar4 = std::operator<<(poVar4,local_250);
          std::endl<char,std::char_traits<char>>(poVar4);
          exit(-1);
        }
        tVar5 = time((time_t *)0x0);
        srand((uint)tVar5);
        poVar4 = std::operator<<((ostream *)this,"dim 0");
        std::endl<char,std::char_traits<char>>(poVar4);
        local_240 = 0;
        iVar6 = local_240;
        if (0 < local_25c) {
          iVar6 = local_25c;
          local_240 = local_25c;
        }
        while (iVar6 != 0) {
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)this,0);
          std::operator<<(poVar4," ");
          iVar6 = iVar6 + -1;
        }
        std::endl<char,std::char_traits<char>>((ostream *)this);
        poVar4 = std::operator<<((ostream *)this,"dim 1");
        std::endl<char,std::char_traits<char>>(poVar4);
        local_238 = (double)local_258;
        iVar6 = 0;
        do {
          iVar8 = iVar6;
          if (iVar8 == local_240) {
            if (local_250 != (char *)0x0) {
              std::ofstream::close();
              poVar4 = std::operator<<((ostream *)&std::cout,"Wrote directed graph to ");
              poVar4 = std::operator<<(poVar4,local_250);
              poVar4 = std::operator<<(poVar4,".");
              std::endl<char,std::char_traits<char>>(poVar4);
            }
            std::ofstream::~ofstream(&file_stream);
            return 0;
          }
          iVar7 = iVar8 + 1;
          local_23c = iVar7;
          for (; iVar6 = local_23c, iVar7 < local_25c; iVar7 = iVar7 + 1) {
            if (((local_258 == 1.0) && (!NAN(local_258))) ||
               (iVar6 = rand(), (double)(iVar6 % 1000) / 1000.0 < local_238)) {
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)this,iVar8);
              poVar4 = std::operator<<(poVar4," ");
              std::ostream::operator<<((ostream *)poVar4,iVar7);
              if (bVar1) {
                std::operator<<((ostream *)this," ");
                iVar6 = rand();
                std::ostream::_M_insert<double>((double)(iVar6 % 100) / 100.0 + 1.0);
              }
              std::endl<char,std::char_traits<char>>((ostream *)this);
              if ((local_248 & 1) == 0) {
                if ((local_258 != 1.0) || (NAN(local_258))) goto LAB_00101652;
LAB_00101677:
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)this,iVar7);
                poVar4 = std::operator<<(poVar4," ");
                std::ostream::operator<<((ostream *)poVar4,iVar8);
                if (bVar1) {
                  std::operator<<((ostream *)this," ");
                  iVar6 = rand();
                  std::ostream::_M_insert<double>((double)(iVar6 % 100) / 100.0 + 1.0);
                }
                std::endl<char,std::char_traits<char>>((ostream *)this);
              }
            }
            else if ((local_248 & 1) == 0) {
LAB_00101652:
              iVar6 = rand();
              if ((double)(iVar6 % 1000) / 1000.0 < local_238) goto LAB_00101677;
            }
          }
        } while( true );
      }
LAB_0010175d:
      print_usage_and_exit(-1);
      std::ofstream::~ofstream(&file_stream);
      _Unwind_Resume(extraout_RAX);
    }
    std::__cxx11::string::string((string *)&file_stream,argv[iVar6],&local_251);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &file_stream,"--help");
    if (bVar3) {
      print_usage_and_exit(0);
      goto LAB_0010175d;
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &file_stream,"--density");
    if (bVar3) {
      dVar9 = atof(argv[(long)iVar6 + 1]);
      local_258 = (float)dVar9;
      iVar6 = iVar6 + 1;
      pcVar2 = local_250;
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &file_stream,"--random-edge-filtration");
      if (bVar3) {
        bVar1 = true;
        pcVar2 = local_250;
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&file_stream,"--undirected");
        if (bVar3) {
          local_248 = CONCAT71(extraout_var,1);
          pcVar2 = local_250;
        }
        else {
          pcVar2 = argv[iVar6];
          if (local_25c < 0) {
            local_25c = atoi(argv[iVar6]);
            pcVar2 = local_250;
          }
        }
      }
    }
    local_250 = pcVar2;
    std::__cxx11::string::~string((string *)&file_stream);
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv) {

	const char* filename = nullptr;
	int n = -1;
	float density = 1.0;
	bool edge_filtration = false;
	bool undirected = false;

	for (int i = 0; i < argc; ++i) {
		const std::string arg(argv[i]);
		if (arg == "--help") {
			print_usage_and_exit(0);
		} else if (arg == "--density") {
			density = float(atof(argv[++i]));
		} else if (arg == "--random-edge-filtration") {
			edge_filtration = true;
		} else if (arg == "--undirected") {
			undirected = true;
		} else {
			if (n > -1) {
				filename = argv[i];
			} else
				n = atoi(argv[i]);
		}
	}

	if (n == -1) { print_usage_and_exit(-1); }

	std::ofstream file_stream(filename);
	if (filename && file_stream.fail()) {
		std::cerr << "couldn't open file " << filename << std::endl;
		exit(-1);
	}

	srand((unsigned int)time(NULL));
	std::ostream& output_stream = filename ? file_stream : std::cout;
	output_stream << "dim 0" << std::endl;
	for (int i = 0; i < n; i++) output_stream << 0 << " ";
	output_stream << std::endl;

	output_stream << "dim 1" << std::endl;
	for (int i = 0; i < n; i++) {
		for (int j = i + 1; j < n; j++) {
			if (density == 1 || (rand() % 1000) / 1000.0 < density) {
				output_stream << i << " " << j;
				if (edge_filtration) output_stream << " " << (1 + (rand() % 100) / 100.0);
				output_stream << std::endl;
			}

			if (undirected) continue;

			if (density == 1 || (rand() % 1000) / 1000.0 < density) {
				output_stream << j << " " << i;
				if (edge_filtration) output_stream << " " << (1 + (rand() % 100) / 100.0);
				output_stream << std::endl;
			}
		}
	}

	if (filename) {
		file_stream.close();
		std::cout << "Wrote directed graph to " << filename << "." << std::endl;
	}
}